

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUURI.cpp
# Opt level: O3

void __thiscall COLLADABU::URI::URI(URI *this,URI *copyFrom_,bool nofrag)

{
  long lVar1;
  undefined7 in_register_00000011;
  String local_50;
  
  (this->mUriString)._M_dataplus._M_p = (pointer)&(this->mUriString).field_2;
  (this->mOriginalURIString)._M_dataplus._M_p = (pointer)&(this->mOriginalURIString).field_2;
  (this->mScheme)._M_dataplus._M_p = (pointer)&(this->mScheme).field_2;
  (this->mAuthority)._M_dataplus._M_p = (pointer)&(this->mAuthority).field_2;
  (this->mPath)._M_dataplus._M_p = (pointer)&(this->mPath).field_2;
  (this->mQuery)._M_dataplus._M_p = (pointer)&(this->mQuery).field_2;
  (this->mFragment)._M_dataplus._M_p = (pointer)&(this->mFragment).field_2;
  this->mIsValid = false;
  (this->mUriString)._M_string_length = 0;
  (this->mUriString).field_2._M_local_buf[0] = '\0';
  (this->mOriginalURIString)._M_string_length = 0;
  (this->mOriginalURIString).field_2._M_local_buf[0] = '\0';
  (this->mScheme)._M_string_length = 0;
  (this->mScheme).field_2._M_local_buf[0] = '\0';
  (this->mAuthority)._M_string_length = 0;
  (this->mAuthority).field_2._M_local_buf[0] = '\0';
  (this->mPath)._M_string_length = 0;
  (this->mPath).field_2._M_local_buf[0] = '\0';
  (this->mQuery)._M_string_length = 0;
  (this->mQuery).field_2._M_local_buf[0] = '\0';
  (this->mFragment).field_2._M_local_buf[0] = '\0';
  (this->mFragment)._M_string_length = 0;
  if ((int)CONCAT71(in_register_00000011,nofrag) == 0) {
    std::__cxx11::string::_M_assign((string *)this);
    std::__cxx11::string::_M_assign((string *)&this->mOriginalURIString);
    std::__cxx11::string::_M_assign((string *)&this->mScheme);
    std::__cxx11::string::_M_assign((string *)&this->mAuthority);
    std::__cxx11::string::_M_assign((string *)&this->mPath);
    std::__cxx11::string::_M_assign((string *)&this->mQuery);
    std::__cxx11::string::_M_assign((string *)&this->mFragment);
    this->mIsValid = copyFrom_->mIsValid;
  }
  else {
    lVar1 = std::__cxx11::string::rfind((char)copyFrom_,0x23);
    if (lVar1 == -1) {
      set(this,&copyFrom_->mUriString,(URI *)0x0);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)copyFrom_);
      set(this,&local_50,(URI *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

URI::URI(const URI& copyFrom_, bool nofrag) 
		: mIsValid(false)
	{
		initialize();
		if (nofrag) {
			const String& uriStr = copyFrom_.getURIString();
			size_t pos = uriStr.find_last_of('#');
			if (pos != String::npos) {
				set(uriStr.substr(0, pos));
				return;
			}
			set(uriStr);
		}
		else
		{
			mUriString = copyFrom_.mUriString;
			mOriginalURIString = copyFrom_.mOriginalURIString;
			mScheme = copyFrom_.mScheme;
			mAuthority = copyFrom_.mAuthority;
			mPath = copyFrom_.mPath;
			mQuery = copyFrom_.mQuery;
			mFragment = copyFrom_.mFragment;
			mIsValid = copyFrom_.mIsValid;
		}
	}